

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

void __thiscall nvim::Nvim::async_win_del_var(Nvim *this,Window window,string *name)

{
  allocator local_49;
  Window local_48;
  string local_40;
  
  local_48 = window;
  std::__cxx11::string::string((string *)&local_40,"nvim_win_del_var",&local_49);
  NvimRPC::async_call<long,std::__cxx11::string>(&this->client_,&local_40,&local_48,name);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Nvim::async_win_del_var(Window window, const std::string& name) {
    client_.async_call("nvim_win_del_var", window, name);
}